

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaObjectBuilder::QMetaObjectBuilder
          (QMetaObjectBuilder *this,QMetaObject *prototype,AddMembers members)

{
  long lVar1;
  char *pcVar2;
  QMetaObjectBuilderPrivate *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *in_stack_00000168;
  QMetaObjectBuilder *in_stack_00000170;
  QFlagsStorage<QMetaObjectBuilder::AddMember> in_stack_0000023c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->className).d.d = (Data *)&PTR__QMetaObjectBuilder_00be4b70;
  pcVar2 = (char *)operator_new(0xd8);
  QMetaObjectBuilderPrivate::QMetaObjectBuilderPrivate(in_RDI);
  (in_RDI->className).d.ptr = pcVar2;
  addMetaObject(in_stack_00000170,in_stack_00000168,(AddMembers)in_stack_0000023c.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMetaObjectBuilder::QMetaObjectBuilder(const QMetaObject *prototype,
                                       QMetaObjectBuilder::AddMembers members)
{
    d = new QMetaObjectBuilderPrivate();
    addMetaObject(prototype, members);
}